

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  LookasideSlot *local_40;
  LookasideSlot *p;
  LookasideSlot *pLStack_30;
  int i;
  void *pStart;
  int cnt_local;
  int sz_local;
  void *pBuf_local;
  sqlite3 *db_local;
  
  if ((db->lookaside).nOut == 0) {
    if ((db->lookaside).bMalloced != '\0') {
      sqlite3_free((db->lookaside).pStart);
    }
    pStart._4_4_ = sz & 0xfffffff8;
    if ((int)pStart._4_4_ < 9) {
      pStart._4_4_ = 0;
    }
    pStart._0_4_ = cnt;
    if (cnt < 0) {
      pStart._0_4_ = 0;
    }
    if ((pStart._4_4_ == 0) || ((int)pStart == 0)) {
      pStart._4_4_ = 0;
      pLStack_30 = (LookasideSlot *)0x0;
    }
    else {
      pLStack_30 = (LookasideSlot *)pBuf;
      if (pBuf == (void *)0x0) {
        sqlite3BeginBenignMalloc();
        pLStack_30 = (LookasideSlot *)sqlite3Malloc((long)(int)(pStart._4_4_ * (int)pStart));
        sqlite3EndBenignMalloc();
        if (pLStack_30 != (LookasideSlot *)0x0) {
          iVar1 = sqlite3MallocSize(pLStack_30);
          pStart._0_4_ = iVar1 / (int)pStart._4_4_;
        }
      }
    }
    (db->lookaside).pStart = pLStack_30;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)pStart._4_4_;
    if (pLStack_30 == (LookasideSlot *)0x0) {
      (db->lookaside).pStart = db;
      (db->lookaside).pEnd = db;
      (db->lookaside).bDisable = 1;
      (db->lookaside).bMalloced = '\0';
    }
    else {
      local_40 = pLStack_30;
      while (p._4_4_ = (int)pStart + -1, -1 < p._4_4_) {
        local_40->pNext = (db->lookaside).pFree;
        (db->lookaside).pFree = local_40;
        local_40 = (LookasideSlot *)((long)&local_40->pNext + (long)(int)pStart._4_4_);
        pStart._0_4_ = p._4_4_;
      }
      (db->lookaside).pEnd = local_40;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
    }
    db_local._4_4_ = 0;
  }
  else {
    db_local._4_4_ = 5;
  }
  return db_local._4_4_;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  if( db->lookaside.nOut ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pFree;
      db->lookaside.pFree = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pStart = db;
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.bMalloced = 0;
  }
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}